

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

TaggedStringPtr __thiscall
google::protobuf::internal::anon_unknown_7::CreateArenaString
          (anon_unknown_7 *this,Arena *arena,string_view s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  TaggedStringPtr res;
  Arena *local_20;
  char *local_18;
  TaggedStringPtr local_10;
  
  local_18 = (char *)s._M_len;
  local_20 = arena;
  p = Arena::Create<std::__cxx11::string,char_const*,unsigned_long>
                ((Arena *)this,&local_18,(unsigned_long *)&local_20);
  TaggedStringPtr::SetMutableArena(&local_10,p);
  return (TaggedStringPtr)local_10.ptr_;
}

Assistant:

TaggedStringPtr CreateArenaString(Arena& arena, absl::string_view s) {
  TaggedStringPtr res;
  res.SetMutableArena(Arena::Create<std::string>(&arena, s.data(), s.length()));
  return res;
}